

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void countInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  long *plVar2;
  CountCtx *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  plVar2 = (long *)sqlite3_aggregate_context(ctx,8);
  if ((argc != 0) && (iVar1 = sqlite3_value_type(*argv), iVar1 == 5)) {
    return;
  }
  if (plVar2 != (long *)0x0) {
    *plVar2 = *plVar2 + -1;
  }
  return;
}

Assistant:

static void countInverse(sqlite3_context *ctx, int argc, sqlite3_value **argv){
  CountCtx *p;
  p = sqlite3_aggregate_context(ctx, sizeof(*p));
  /* p is always non-NULL since countStep() will have been called first */
  if( (argc==0 || SQLITE_NULL!=sqlite3_value_type(argv[0])) && ALWAYS(p) ){
    p->n--;
#ifdef SQLITE_DEBUG
    p->bInverse = 1;
#endif
  }
}